

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O3

void Curl_dnscache_prune(Curl_easy *data)

{
  Curl_multi *pCVar1;
  time_t tVar2;
  size_t sVar3;
  int iVar4;
  Curl_hash *h;
  Curl_multi *local_58;
  time_t local_48;
  long local_40;
  int local_38;
  
  pCVar1 = (Curl_multi *)data->share;
  if ((pCVar1 == (Curl_multi *)0x0) || ((pCVar1->xfers_alive & 8) == 0)) {
    local_58 = data->multi;
    if (local_58 == (Curl_multi *)0x0) {
      return;
    }
    h = &(local_58->dnscache).entries;
    iVar4 = (data->set).dns_cache_timeout;
    if (pCVar1 != local_58) goto LAB_001316fb;
  }
  else {
    h = &(pCVar1->dnscache).entries;
    iVar4 = (data->set).dns_cache_timeout;
    local_58 = pCVar1;
  }
  Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
LAB_001316fb:
  tVar2 = time((time_t *)0x0);
  do {
    local_40 = 0;
    local_48 = tVar2;
    local_38 = iVar4;
    Curl_hash_clean_with_criterium(h,&local_48,dnscache_entry_is_stale);
    iVar4 = (int)local_40;
    if (0x7ffffffe < local_40) {
      iVar4 = 0x7ffffffe;
    }
  } while ((iVar4 != 0) && (sVar3 = Curl_hash_count(h), 29999 < sVar3));
  if ((Curl_multi *)data->share == local_58) {
    Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
  }
  return;
}

Assistant:

void Curl_dnscache_prune(struct Curl_easy *data)
{
  struct Curl_dnscache *dnscache = dnscache_get(data);
  time_t now;
  /* the timeout may be set -1 (forever) */
  int timeout = data->set.dns_cache_timeout;

  if(!dnscache)
    /* NULL hostcache means we cannot do it */
    return;

  dnscache_lock(data, dnscache);

  now = time(NULL);

  do {
    /* Remove outdated and unused entries from the hostcache */
    time_t oldest = dnscache_prune(&dnscache->entries, timeout, now);

    if(oldest < INT_MAX)
      timeout = (int)oldest; /* we know it fits */
    else
      timeout = INT_MAX - 1;

    /* if the cache size is still too big, use the oldest age as new
       prune limit */
  } while(timeout &&
          (Curl_hash_count(&dnscache->entries) > MAX_DNS_CACHE_SIZE));

  dnscache_unlock(data, dnscache);
}